

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O0

bool __thiscall Threading::Event::_Wait(Event *this,TimeOut *rcxTO)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  int iVar4;
  byte local_b9;
  int local_b8;
  int iStack_b4;
  bool bState_1;
  int retval;
  int mutexLockSuccess_1;
  __pthread_cleanup_class __clframe_2;
  timeval tOut;
  timespec abstime;
  undefined1 local_70 [4];
  int retValue_1;
  __pthread_cleanup_class __clframe_1;
  int local_48;
  int retValue;
  int mutexLockSuccess;
  __pthread_cleanup_class __clframe;
  bool bState;
  bool isOkay;
  TimeOut *rcxTO_local;
  Event *this_local;
  
  __clframe.__cancel_type._3_1_ = 0;
  uVar2 = TimeOut::operator_cast_to_unsigned_int(rcxTO);
  uVar3 = TimeOut::operator_cast_to_unsigned_int((TimeOut *)&Infinite);
  if (uVar2 == uVar3) {
    __clframe.__cancel_type._2_1_ = 0;
    __pthread_cleanup_class::__pthread_cleanup_class
              ((__pthread_cleanup_class *)&retValue,pthread_mutex_unlock,this);
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
    local_48 = 0;
    if (iVar4 == 0) {
      __clframe.__cancel_type._2_1_ = (byte)this[0x29] & 1;
      if (__clframe.__cancel_type._2_1_ == 0) {
        while (((__clframe.__cancel_type._2_1_ ^ 0xff) & 1) != 0) {
          local_48 = pthread_cond_wait((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this);
          if (local_48 != 4) {
            if (local_48 != 0) {
              __clframe.__cancel_type._3_1_ = 0;
              break;
            }
            __clframe.__cancel_type._2_1_ = (byte)this[0x29] & 1;
          }
        }
        if (local_48 == 0) {
          if (((byte)this[0x28] & 1) == 0) {
            this[0x29] = (Event)0x0;
          }
          __clframe.__cancel_type._3_1_ = 1;
        }
      }
      else {
        if (((byte)this[0x28] & 1) == 0) {
          this[0x29] = (Event)0x0;
        }
        __clframe.__cancel_type._3_1_ = 1;
      }
    }
    __pthread_cleanup_class::__setdoit((__pthread_cleanup_class *)&retValue,(uint)(iVar4 == 0));
    __pthread_cleanup_class::~__pthread_cleanup_class((__pthread_cleanup_class *)&retValue);
    this_local._7_1_ = (bool)(__clframe.__cancel_type._3_1_ & 1);
  }
  else {
    uVar2 = TimeOut::operator_cast_to_unsigned_int(rcxTO);
    uVar3 = TimeOut::operator_cast_to_unsigned_int((TimeOut *)&InstantCheck);
    if (uVar2 == uVar3) {
      __pthread_cleanup_class::__pthread_cleanup_class
                ((__pthread_cleanup_class *)local_70,pthread_mutex_unlock,this);
      iVar4 = pthread_mutex_trylock((pthread_mutex_t *)this);
      if (((iVar4 == 0) &&
          (__clframe.__cancel_type._3_1_ = (byte)this[0x29] & 1, ((byte)this[0x29] & 1) != 0)) &&
         (((byte)this[0x28] & 1) == 0)) {
        this[0x29] = (Event)0x0;
      }
      __pthread_cleanup_class::__setdoit((__pthread_cleanup_class *)local_70,(uint)(iVar4 == 0));
      __pthread_cleanup_class::~__pthread_cleanup_class((__pthread_cleanup_class *)local_70);
      this_local._7_1_ = (bool)(__clframe.__cancel_type._3_1_ & 1);
    }
    else {
      gettimeofday((timeval *)&__clframe_2.__do_it,(__timezone_ptr_t)0x0);
      uVar2 = TimeOut::operator_cast_to_unsigned_int(rcxTO);
      tOut.tv_sec = (ulong)((uVar2 % 1000) * 1000) + tOut.tv_sec;
      uVar2 = TimeOut::operator_cast_to_unsigned_int(rcxTO);
      __clframe_2._16_8_ = (ulong)uVar2 / 1000 + __clframe_2._16_8_;
      if (1000000 < tOut.tv_sec) {
        __clframe_2._16_8_ = __clframe_2._16_8_ + 1;
        tOut.tv_sec = tOut.tv_sec + -1000000;
      }
      tOut.tv_usec._0_4_ = __clframe_2.__do_it;
      tOut.tv_usec._4_4_ = __clframe_2.__cancel_type;
      __pthread_cleanup_class::__pthread_cleanup_class
                ((__pthread_cleanup_class *)&retval,pthread_mutex_unlock,this);
      iStack_b4 = -1;
      local_b8 = 0;
      while ((bVar1 = stillBefore((timeval *)&__clframe_2.__do_it), bVar1 &&
             (iStack_b4 = pthread_mutex_trylock((pthread_mutex_t *)this), iStack_b4 != 0))) {
        sched_yield();
      }
      if (iStack_b4 == 0) {
        if (((byte)this[0x29] & 1) == 0) {
          local_b9 = 0;
          while (((local_b9 ^ 0xff) & 1) != 0) {
            local_b8 = 4;
            while (local_b8 == 4) {
              local_b8 = pthread_cond_timedwait
                                   ((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this,
                                    (timespec *)&tOut.tv_usec);
            }
            if (local_b8 != 0) break;
            local_b9 = (byte)this[0x29] & 1;
          }
          if (local_b8 == 0) {
            if (((byte)this[0x28] & 1) == 0) {
              this[0x29] = (Event)0x0;
            }
            __clframe.__cancel_type._3_1_ = 1;
          }
        }
        else {
          if (((byte)this[0x28] & 1) == 0) {
            this[0x29] = (Event)0x0;
          }
          __clframe.__cancel_type._3_1_ = 1;
        }
      }
      __pthread_cleanup_class::__setdoit((__pthread_cleanup_class *)&retval,(uint)(iStack_b4 == 0));
      __pthread_cleanup_class::~__pthread_cleanup_class((__pthread_cleanup_class *)&retval);
      this_local._7_1_ = (bool)(__clframe.__cancel_type._3_1_ & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Threading::Event::_Wait(const TimeOut & rcxTO) volatile
{
  #ifndef _POSIX
    bool isOkay = false;
    // compute time delay
    portTickType  tickDelay = rcxTO == Infinite ? portMAX_DELAY : (rcxTO == InstantCheck ? 0 : rcxTO / portTICK_RATE_MS);
    portBASE_TYPE  result;
    unsigned portLONG ulVar = 0;

    // The value in the queue must be removed
    if (!manualReset)
    {
        // The queue is automatically freed
        return xQueueReceive(xQueue, &ulVar, tickDelay) == pdTRUE;
    }
    // The queue is not automatically freed
    return xQueuePeek(xQueue, &ulVar, tickDelay) == pdTRUE;
  #else
    bool isOkay = false;
    if (rcxTO == Infinite)
    {
        bool bState = false;
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = pthread_mutex_lock((HMUTEX*)&event), retValue = 0;
        if (mutexLockSuccess == 0)
        {
            bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    // pthread_cond_wait release the mxEvent mutex and
                    // lock the condition atomically
                    // Because if any other thread wants to modify the state
                    // it has to lock the mutex, the change will be protected then
                    if ((retValue = pthread_cond_wait((pthread_cond_t*)&condition, (HMUTEX*)&event)) == EINTR) continue;
                    if (retValue != 0)
                    {   // An error occurred
                        isOkay = false; break;
                    }
                    bState = state;
                }

                if (!retValue)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }

        } // else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
    else if (rcxTO == InstantCheck)
    {
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int retValue = pthread_mutex_trylock((HMUTEX*)&event);
        if (retValue == 0)
        {
            isOkay = state;
            // Is it in auto reset mode ?
            if (state && !manualReset) state = false;

        } //else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(retValue == 0);
        return isOkay;
    }
    else // Wait with time out
    {
        // Process the absolute time for timeout
        struct timespec abstime;
        struct timeval tOut;
        gettimeofday(&tOut, NULL);
        tOut.tv_usec += (uint32)(rcxTO % 1000) * 1000;
        tOut.tv_sec += (uint32)rcxTO / 1000;
        if (tOut.tv_usec > 1000000)
        { tOut.tv_sec ++; tOut.tv_usec -= 1000000;  }
        abstime.tv_sec = tOut.tv_sec;
        abstime.tv_nsec = tOut.tv_usec * 1000;

        // First try to lock the mutex
        // Sadly, we must poll here

        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = -1, retval = 0;
        // Poll to get the mutex
        while (stillBefore(&tOut))
        {
            mutexLockSuccess = pthread_mutex_trylock((HMUTEX*)&event);
            if (mutexLockSuccess == 0) break;
            // We didn't get the mutex, so sleep a little (to avoid polling)
            sched_yield();
        }
        if (mutexLockSuccess == 0)
        {   // We now have the mutex, so check the state
            bool bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {   // Unset here, so wait for the condition
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    retval = EINTR;
                    while (retval == EINTR) retval = pthread_cond_timedwait((pthread_cond_t*)&condition, (HMUTEX*)&event, &abstime);

                    if (retval != 0) //== ETIMEDOUT)
                    {   // No change in the specified time, so release the mutex and return
                        break;
                    }

                    // A thread could have reset a unset state, thus causing condition
                    // broadcasting. We have to make sure the state is good now
                    bState = state;
                }

                if (!retval)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }
        }
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
  #endif
}